

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool set_process_priority(ggml_sched_priority prio)

{
  int iVar1;
  common_log *log;
  uint *puVar2;
  char *pcVar3;
  
  switch((ulong)prio) {
  case 0:
    return true;
  case 1:
    iVar1 = -5;
    break;
  case 2:
    iVar1 = -10;
    break;
  case 3:
    iVar1 = -0x14;
    break;
  default:
    iVar1 = 0;
  }
  iVar1 = setpriority(PRIO_PROCESS,0,iVar1);
  if ((iVar1 == 0) && (-1 < common_log_verbosity_thold)) {
    log = common_log_main();
    puVar2 = (uint *)__errno_location();
    pcVar3 = strerror(*puVar2);
    common_log_add(log,GGML_LOG_LEVEL_WARN,"failed to set process priority %d : %s (%d)\n",
                   (ulong)prio,pcVar3,(ulong)*puVar2);
  }
  return iVar1 != 0;
}

Assistant:

bool set_process_priority(enum ggml_sched_priority prio) {
    if (prio == GGML_SCHED_PRIO_NORMAL) {
        return true;
    }

    int p = 0;
    switch (prio) {
        case GGML_SCHED_PRIO_NORMAL:   p =  0;  break;
        case GGML_SCHED_PRIO_MEDIUM:   p = -5;  break;
        case GGML_SCHED_PRIO_HIGH:     p = -10; break;
        case GGML_SCHED_PRIO_REALTIME: p = -20; break;
    }

    if (!setpriority(PRIO_PROCESS, 0, p)) {
        LOG_WRN("failed to set process priority %d : %s (%d)\n", prio, strerror(errno), errno);
        return false;
    }
    return true;
}